

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

lu_mem propagatemark(global_State *g)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  lua_State *L;
  CallInfo *pCVar4;
  UpVal *o;
  lua_CFunction p_Var5;
  bool bVar6;
  lua_Alloc *pp_Var7;
  byte bVar8;
  uint uVar9;
  GCObject **ppGVar10;
  TValue *pTVar11;
  ulong uVar12;
  lu_mem lVar13;
  StkId pSVar14;
  char *pcVar15;
  char *pcVar16;
  int iVar17;
  GCObject *pGVar18;
  ulong uVar19;
  long lVar20;
  global_State *pgVar21;
  long lVar22;
  StkIdRel *pSVar23;
  anon_union_16_2_5131162a_for_u *paVar24;
  global_State *pgVar25;
  bool bVar26;
  
  L = (lua_State *)g->gray;
  bVar1 = L->marked;
  L->marked = bVar1 | 0x20;
  ppGVar10 = getgclist((GCObject *)L);
  g->gray = *ppGVar10;
  lVar13 = 0;
  switch(L->tt) {
  case '\x05':
    pSVar14 = (L->stack_last).p;
    if (pSVar14 == (StkId)0x0) {
LAB_00113818:
      pgVar25 = L->l_G;
      bVar1 = L->allowhook;
      uVar9 = luaH_realasize((Table *)L);
      for (lVar22 = 0; (ulong)uVar9 << 4 != lVar22; lVar22 = lVar22 + 0x10) {
        if (((*(byte *)((long)(L->top).p + lVar22 + 8) & 0x40) != 0) &&
           (pGVar18 = *(GCObject **)((long)(L->top).p + lVar22), (pGVar18->marked & 0x18) != 0)) {
          reallymarkobject(g,pGVar18);
        }
      }
      for (pgVar21 = L->l_G;
          pgVar21 < (global_State *)(&pgVar25->frealloc + (long)(1 << (bVar1 & 0x1f)) * 3);
          pgVar21 = (global_State *)&pgVar21->GCdebt) {
        bVar8 = *(byte *)&pgVar21->ud;
        if ((bVar8 & 0xf) == 0) {
          if (((ulong)pgVar21->ud & 0x4000) != 0) {
            *(undefined1 *)((long)&pgVar21->ud + 1) = 0xb;
          }
        }
        else {
          if ((((ulong)pgVar21->ud & 0x4000) != 0) &&
             ((((GCObject *)pgVar21->totalbytes)->marked & 0x18) != 0)) {
            reallymarkobject(g,(GCObject *)pgVar21->totalbytes);
            bVar8 = *(byte *)&pgVar21->ud;
          }
          if (((bVar8 & 0x40) != 0) && ((((GCObject *)pgVar21->frealloc)->marked & 0x18) != 0)) {
            reallymarkobject(g,(GCObject *)pgVar21->frealloc);
          }
        }
      }
      genlink(g,(GCObject *)L);
    }
    else {
      if (((pSVar14->tbclist).delta & 8) == 0) {
        pTVar11 = luaT_gettm((Table *)&pSVar14->val,TM_MODE,g->tmname[3]);
        pSVar14 = (L->stack_last).p;
        if (pSVar14 != (StkId)0x0) goto LAB_001137ad;
      }
      else {
        pTVar11 = (TValue *)0x0;
LAB_001137ad:
        if ((undefined1  [16])((undefined1  [16])*pSVar14 & (undefined1  [16])0x1800) !=
            (undefined1  [16])0x0) {
          reallymarkobject(g,(GCObject *)&pSVar14->val);
        }
      }
      if ((pTVar11 == (TValue *)0x0) || (pTVar11->tt_ != 'D')) goto LAB_00113818;
      p_Var5 = (pTVar11->value_).f;
      pcVar15 = strchr((char *)(p_Var5 + 0x18),0x6b);
      pcVar16 = strchr((char *)(p_Var5 + 0x18),0x76);
      if (pcVar15 == (char *)0x0 && pcVar16 == (char *)0x0) goto LAB_00113818;
      if (pcVar15 == (char *)0x0) {
        bVar1 = L->allowhook;
        pgVar25 = L->l_G;
        pp_Var7 = &pgVar25->frealloc;
        bVar26 = *(int *)&L->nci != 0;
        for (; pgVar25 < (global_State *)(pp_Var7 + (long)(1 << (bVar1 & 0x1f)) * 3);
            pgVar25 = (global_State *)&pgVar25->GCdebt) {
          bVar6 = ((ulong)pgVar25->ud & 0x4000) != 0;
          if (((ulong)pgVar25->ud & 0xf) == 0) {
            if (bVar6) {
              *(undefined1 *)((long)&pgVar25->ud + 1) = 0xb;
            }
          }
          else {
            if ((bVar6) && ((((GCObject *)pgVar25->totalbytes)->marked & 0x18) != 0)) {
              reallymarkobject(g,(GCObject *)pgVar25->totalbytes);
            }
            bVar6 = !bVar26;
            bVar26 = true;
            if (bVar6) {
              if (((ulong)pgVar25->ud & 0x40) == 0) {
                pGVar18 = (GCObject *)0x0;
              }
              else {
                pGVar18 = (GCObject *)pgVar25->frealloc;
              }
              iVar17 = iscleared(g,pGVar18);
              bVar26 = iVar17 != 0;
            }
          }
        }
        bVar26 = bVar26 && g->gcstate == '\x02';
        L->stack = *(StkIdRel *)(&g->grayagain + bVar26);
        (&g->grayagain)[bVar26] = (GCObject *)L;
LAB_00113a2e:
        L->marked = L->marked & 199;
      }
      else {
        if (pcVar16 != (char *)0x0) {
          L->stack = (StkIdRel)g->allweak;
          g->allweak = (GCObject *)L;
          goto LAB_00113a2e;
        }
        traverseephemeron(g,(Table *)L,0);
      }
    }
    if (L->ci == (CallInfo *)0x0) {
      iVar17 = 0;
    }
    else {
      iVar17 = 2 << (L->allowhook & 0x1f);
    }
    lVar13 = (lu_mem)(*(int *)&L->nci + iVar17 + 1);
    break;
  case '\x06':
    pgVar25 = L->l_G;
    if ((pgVar25 != (global_State *)0x0) && (((ulong)pgVar25->ud & 0x1800) != 0)) {
      reallymarkobject(g,(GCObject *)pgVar25);
    }
    for (uVar19 = 0; uVar12 = (ulong)L->status, uVar19 < uVar12; uVar19 = uVar19 + 1) {
      pCVar4 = (&L->ci)[uVar19];
      if ((pCVar4 != (CallInfo *)0x0) && (((pCVar4->top).offset & 0x1800U) != 0)) {
        reallymarkobject(g,(GCObject *)pCVar4);
      }
    }
    goto LAB_001136a0;
  case '\a':
    pgVar25 = L->l_G;
    if ((pgVar25 != (global_State *)0x0) && (((ulong)pgVar25->ud & 0x1800) != 0)) {
      reallymarkobject(g,(GCObject *)pgVar25);
    }
    pSVar23 = &L->stack;
    for (uVar19 = 0; uVar2._0_1_ = L->status, uVar2._1_1_ = L->allowhook, uVar19 < uVar2;
        uVar19 = uVar19 + 1) {
      if ((((ulong)*pSVar23 & 0x40) != 0) &&
         ((undefined1  [16])((undefined1  [16])*pSVar23[-1].p & (undefined1  [16])0x1800) !=
          (undefined1  [16])0x0)) {
        reallymarkobject(g,(GCObject *)&(pSVar23[-1].p)->val);
      }
      pSVar23 = pSVar23 + 2;
    }
    genlink(g,(GCObject *)L);
    uVar3._0_1_ = L->status;
    uVar3._1_1_ = L->allowhook;
    uVar12 = (ulong)uVar3;
    goto LAB_001136a0;
  case '\b':
    pSVar14 = (L->stack).p;
    if (((bVar1 & 6) != 0) || (g->gcstate == '\0')) {
      L->gclist = g->grayagain;
      g->grayagain = (GCObject *)L;
      L->marked = bVar1 & 199;
    }
    if (pSVar14 == (StkId)0x0) {
      lVar13 = 1;
    }
    else {
      for (; pSVar14 < (L->top).p; pSVar14 = pSVar14 + 1) {
        if ((((pSVar14->val).tt_ & 0x40) != 0) && (((*(GCObject **)pSVar14)->marked & 0x18) != 0)) {
          reallymarkobject(g,*(GCObject **)pSVar14);
        }
      }
      paVar24 = (anon_union_16_2_5131162a_for_u *)&L->openupval;
      while (o = (paVar24->open).next, o != (UpVal *)0x0) {
        if ((o->marked & 0x18) != 0) {
          reallymarkobject(g,(GCObject *)o);
        }
        paVar24 = &o->u;
      }
      if (g->gcstate == '\x02') {
        if (g->gcemergency == '\0') {
          luaD_shrinkstack(L);
        }
        for (pSVar14 = (L->top).p; pSVar14 < (StkId)((L->stack_last).offset + 0x50);
            pSVar14 = pSVar14 + 1) {
          (pSVar14->val).tt_ = '\0';
        }
        if ((L->twups == L) && (L->openupval != (UpVal *)0x0)) {
          L->twups = g->twups;
          g->twups = L;
        }
      }
      lVar13 = ((long)(L->stack_last).p - (L->stack).offset) * 0x10000000 + 0x100000000 >> 0x20;
    }
    break;
  case '\t':
    break;
  case '\n':
    pCVar4 = (L->base_ci).previous;
    if ((pCVar4 != (CallInfo *)0x0) && (((pCVar4->top).offset & 0x1800U) != 0)) {
      reallymarkobject(g,(GCObject *)pCVar4);
    }
    lVar22 = 8;
    for (lVar20 = 0; lVar20 < *(int *)((long)&L->top + 4); lVar20 = lVar20 + 1) {
      if (((*(byte *)((long)&L->openupval->next + lVar22) & 0x40) != 0) &&
         (pGVar18 = *(GCObject **)((long)L->openupval + lVar22 + -8), (pGVar18->marked & 0x18) != 0)
         ) {
        reallymarkobject(g,pGVar18);
      }
      lVar22 = lVar22 + 0x10;
    }
    lVar20 = 0;
    for (lVar22 = 0; lVar22 < *(int *)&L->top; lVar22 = lVar22 + 1) {
      pGVar18 = *(GCObject **)((long)&L->twups->next + lVar20);
      if ((pGVar18 != (GCObject *)0x0) && ((pGVar18->marked & 0x18) != 0)) {
        reallymarkobject(g,pGVar18);
      }
      lVar20 = lVar20 + 0x10;
    }
    for (lVar22 = 0; lVar22 < *(int *)&L->ci; lVar22 = lVar22 + 1) {
      pGVar18 = (&L->gclist->next)[lVar22];
      if ((pGVar18 != (GCObject *)0x0) && ((pGVar18->marked & 0x18) != 0)) {
        reallymarkobject(g,pGVar18);
      }
    }
    lVar20 = 0;
    for (lVar22 = 0; iVar17 = *(int *)((long)&L->ci + 4), lVar22 < iVar17; lVar22 = lVar22 + 1) {
      pGVar18 = *(GCObject **)((long)(L->base_ci).top.p + lVar20);
      if ((pGVar18 != (GCObject *)0x0) && ((pGVar18->marked & 0x18) != 0)) {
        reallymarkobject(g,pGVar18);
      }
      lVar20 = lVar20 + 0x10;
    }
    lVar13 = (lu_mem)(iVar17 + *(int *)((long)&L->top + 4) + *(int *)&L->top + *(int *)&L->ci + 1);
    break;
  default:
    if (L->tt != '&') {
      return 0;
    }
    pSVar23 = &L->stack_last;
    for (uVar19 = 0; uVar12 = (ulong)L->status, uVar19 < uVar12; uVar19 = uVar19 + 1) {
      if ((((ulong)*pSVar23 & 0x40) != 0) &&
         (((((CallInfo *)pSVar23[-1].p)->top).offset & 0x1800U) != 0)) {
        reallymarkobject(g,(GCObject *)pSVar23[-1].p);
      }
      pSVar23 = pSVar23 + 2;
    }
LAB_001136a0:
    lVar13 = uVar12 + 1;
  }
  return lVar13;
}

Assistant:

static lu_mem propagatemark (global_State *g) {
  GCObject *o = g->gray;
  nw2black(o);
  g->gray = *getgclist(o);  /* remove from 'gray' list */
  switch (o->tt) {
    case LUA_VTABLE: return traversetable(g, gco2t(o));
    case LUA_VUSERDATA: return traverseudata(g, gco2u(o));
    case LUA_VLCL: return traverseLclosure(g, gco2lcl(o));
    case LUA_VCCL: return traverseCclosure(g, gco2ccl(o));
    case LUA_VPROTO: return traverseproto(g, gco2p(o));
    case LUA_VTHREAD: return traversethread(g, gco2th(o));
    default: lua_assert(0); return 0;
  }
}